

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O0

void Cec2_ManSimulateCis(Gia_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pObj;
  bool bVar2;
  int local_18;
  int local_14;
  int Id;
  int i;
  Gia_Man_t *p_local;
  
  local_14 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar2 = false;
    if (local_14 < iVar1) {
      pObj = Gia_ManCi(p,local_14);
      local_18 = Gia_ObjId(p,pObj);
      bVar2 = local_18 != 0;
    }
    if (!bVar2) break;
    Cec2_ObjSimCi(p,local_18);
    local_14 = local_14 + 1;
  }
  p->iPatsPi = 0;
  return;
}

Assistant:

void Cec2_ManSimulateCis( Gia_Man_t * p )
{
    int i, Id;
    Gia_ManForEachCiId( p, Id, i )
        Cec2_ObjSimCi( p, Id );
    p->iPatsPi = 0;
}